

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTimeConstraint.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_31bae::TestTimeConstraintFailureIncludesCorrectData::
~TestTimeConstraintFailureIncludesCorrectData(TestTimeConstraintFailureIncludesCorrectData *this)

{
  TestTimeConstraintFailureIncludesCorrectData *this_local;
  
  ~TestTimeConstraintFailureIncludesCorrectData(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TimeConstraintFailureIncludesCorrectData)
{
    RecordingReporter reporter;
    TestResults result(&reporter);
    {
		ScopedCurrentTest scopedResult(result);

		TestDetails const details("testname", "suitename", "filename", 10);
        TimeConstraint t(10, details);
        TimeHelpers::SleepMs(20);
    }

	using namespace std;

	CHECK(strstr(reporter.lastFailedFile, "filename"));
    CHECK_EQUAL(10, reporter.lastFailedLine);
    CHECK(strstr(reporter.lastFailedTest, "testname"));
}